

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O0

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *p,Mio_Library_t *pMio)

{
  uint uVar1;
  Vec_Wec_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Mpm_Par_t *pMVar7;
  Mig_Obj_t *pObj_00;
  Mpm_Cut_t *pMVar8;
  Vec_Int_t *p_04;
  void *pvVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  bool bVar12;
  int Config;
  int fCompl;
  int iMigLit;
  int iNode;
  int k;
  int i;
  Mpm_Cut_t *pCutBest;
  Mig_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vClass;
  Vec_Int_t *vCopy;
  Vec_Int_t *vNodes;
  Vec_Ptr_t *vNpnGatesMio;
  Abc_Ntk_t *pNtk;
  Mio_Library_t *pMio_local;
  Mpm_Man_t *p_local;
  
  p_01 = Mpm_ManFindCells(pMio,(SC_Lib *)p->pPars->pScl,p->vNpnConfigs);
  if (p_01 == (Vec_Ptr_t *)0x0) {
    printf("Genlib library does not match SCL library.\n");
    p_local = (Mpm_Man_t *)0x0;
  }
  else {
    iVar2 = Mig_ManObjNum(p->pMig);
    p_02 = Vec_IntStartFull(iVar2 << 1);
    p_03 = Mpm_ManFindMappedNodes(p);
    p_local = (Mpm_Man_t *)Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_MAP,1);
    pMVar7 = (Mpm_Par_t *)Extra_UtilStrsav(p->pMig->pName);
    p_local->pPars = pMVar7;
    p_local->pCutStore[0x16] = (Mpm_Uni_t *)pMio;
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(&p->pMig->vCis);
      bVar12 = false;
      if (iNode < iVar2) {
        pCutBest = (Mpm_Cut_t *)Mig_ManCi(p->pMig,iNode);
        bVar12 = pCutBest != (Mpm_Cut_t *)0x0;
      }
      if (!bVar12) break;
      pAVar10 = Abc_NtkCreatePi((Abc_Ntk_t *)p_local);
      iVar2 = Mig_ObjId((Mig_Obj_t *)pCutBest);
      iVar2 = Abc_Var2Lit(iVar2,0);
      uVar4 = Abc_ObjId(pAVar10);
      Vec_IntWriteEntry(p_02,iVar2,uVar4);
      iNode = iNode + 1;
    }
    Abc_NtkAddDummyPiNames((Abc_Ntk_t *)p_local);
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(&p->pMig->vCos);
      bVar12 = false;
      if (iNode < iVar2) {
        pCutBest = (Mpm_Cut_t *)Mig_ManCo(p->pMig,iNode);
        bVar12 = pCutBest != (Mpm_Cut_t *)0x0;
      }
      if (!bVar12) goto LAB_0055b5cb;
      iVar2 = Mig_ObjFaninLit((Mig_Obj_t *)pCutBest,0);
      if (iVar2 == 0) break;
      iNode = iNode + 1;
    }
    pAVar10 = Abc_NtkCreateNodeConst0((Abc_Ntk_t *)p_local);
    iVar2 = Abc_Var2Lit(0,0);
    uVar4 = Abc_ObjId(pAVar10);
    Vec_IntWriteEntry(p_02,iVar2,uVar4);
LAB_0055b5cb:
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(&p->pMig->vCos);
      bVar12 = false;
      if (iNode < iVar2) {
        pCutBest = (Mpm_Cut_t *)Mig_ManCo(p->pMig,iNode);
        bVar12 = pCutBest != (Mpm_Cut_t *)0x0;
      }
      if (!bVar12) goto LAB_0055b694;
      iVar2 = Mig_ObjFaninLit((Mig_Obj_t *)pCutBest,0);
      if (iVar2 == 1) break;
      iNode = iNode + 1;
    }
    pAVar10 = Abc_NtkCreateNodeConst1((Abc_Ntk_t *)p_local);
    iVar2 = Abc_Var2Lit(0,1);
    uVar4 = Abc_ObjId(pAVar10);
    Vec_IntWriteEntry(p_02,iVar2,uVar4);
LAB_0055b694:
    for (iNode = 0; iVar2 = Vec_IntSize(p_03), iNode < iVar2; iNode = iNode + 1) {
      iVar2 = Vec_IntEntry(p_03,iNode);
      pObj_00 = Mig_ManObj(p->pMig,iVar2);
      pMVar8 = Mpm_ObjCutBestP(p,pObj_00);
      p_00 = p->vNpnConfigs;
      iVar3 = Abc_Lit2Var(*(uint *)&pMVar8->field_0x4 & 0x1ffffff);
      p_04 = Vec_WecEntry(p_00,iVar3);
      uVar4 = Vec_IntEntry(p_04,0);
      pAVar10 = Abc_NtkCreateNode((Abc_Ntk_t *)p_local);
      iVar3 = Abc_Lit2Var(*(uint *)&pMVar8->field_0x4 & 0x1ffffff);
      pvVar9 = Vec_PtrEntry(p_01,iVar3);
      (pAVar10->field_5).pData = pvVar9;
      if ((pAVar10->field_5).pData == (void *)0x0) {
        __assert_fail("pObj->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                      ,0xe0,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
      }
      uVar1 = *(uint *)&pMVar8->field_0x4;
      uVar5 = Abc_LitIsCompl(*(uint *)&pMVar8->field_0x4 & 0x1ffffff);
      for (iMigLit = 0; iMigLit < (int)(*(uint *)&pMVar8->field_0x4 >> 0x1b); iMigLit = iMigLit + 1)
      {
        uVar6 = (int)(uVar4 & 0xffff) >> 6;
        if (0x2cf < uVar6) {
          __assert_fail("(Config >> 6) < 720",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                        ,0xe5,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
        }
        iVar3 = Abc_LitNotCond(pMVar8->pLeaves[(int)p->Perm6[(int)uVar6][iMigLit]],
                               (int)(uVar4 & 0xffff) >> ((byte)iMigLit & 0x1f) & 1);
        pAVar11 = Mpm_ManGetAbcNode((Abc_Ntk_t *)p_local,p_02,iVar3);
        Abc_ObjAddFanin(pAVar10,pAVar11);
      }
      iVar2 = Abc_Var2Lit(iVar2,uVar1 >> 0x19 & 1 ^ uVar5 ^ (int)uVar4 >> 0x10 & 1U);
      uVar4 = Abc_ObjId(pAVar10);
      Vec_IntWriteEntry(p_02,iVar2,uVar4);
    }
    iNode = 0;
    while( true ) {
      iVar2 = Vec_IntSize(&p->pMig->vCos);
      bVar12 = false;
      if (iNode < iVar2) {
        pCutBest = (Mpm_Cut_t *)Mig_ManCo(p->pMig,iNode);
        bVar12 = pCutBest != (Mpm_Cut_t *)0x0;
      }
      if (!bVar12) break;
      pAVar10 = Abc_NtkCreatePo((Abc_Ntk_t *)p_local);
      iVar2 = Mig_ObjFaninLit((Mig_Obj_t *)pCutBest,0);
      pAVar11 = Mpm_ManGetAbcNode((Abc_Ntk_t *)p_local,p_02,iVar2);
      Abc_ObjAddFanin(pAVar10,pAVar11);
      iNode = iNode + 1;
    }
    Abc_NtkAddDummyPoNames((Abc_Ntk_t *)p_local);
    Vec_PtrFree(p_01);
    Vec_IntFree(p_03);
    Vec_IntFree(p_02);
  }
  return (Abc_Ntk_t *)p_local;
}

Assistant:

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk( Mpm_Man_t * p, Mio_Library_t * pMio )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vNodes, * vCopy, * vClass;
    Abc_Obj_t * pObj, * pFanin;
    Mig_Obj_t * pNode;
    Mpm_Cut_t * pCutBest;
    int i, k, iNode, iMigLit, fCompl, Config;

    // find mapping of SCL cells into MIO cells
    vNpnGatesMio = Mpm_ManFindCells( pMio, (SC_Lib *)p->pPars->pScl, p->vNpnConfigs );
    if ( vNpnGatesMio == NULL )
    {
        printf( "Genlib library does not match SCL library.\n" );
        return NULL;
    }

    // create mapping for each phase of each node
    vCopy = Vec_IntStartFull( 2 * Mig_ManObjNum(p->pMig) );

    // get internal nodes
    vNodes = Mpm_ManFindMappedNodes( p );

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_MAP, 1 );
    pNtk->pName = Extra_UtilStrsav( p->pMig->pName );
    pNtk->pManFunc = pMio;

    // create primary inputs
    Mig_ManForEachCi( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePi(pNtk);
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit( Mig_ObjId(pNode), 0 ), Abc_ObjId(pObj) );
    }
    Abc_NtkAddDummyPiNames( pNtk );

    // create constant nodes
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 0 )
        {
            pObj = Abc_NtkCreateNodeConst0(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 0 ), Abc_ObjId(pObj) );
            break;
        }
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 1 )
        {
            pObj = Abc_NtkCreateNodeConst1(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 1 ), Abc_ObjId(pObj) );
            break;
        }

    // create internal nodes
    Vec_IntForEachEntry( vNodes, iNode, i )
    {
        pCutBest = Mpm_ObjCutBestP( p, Mig_ManObj(p->pMig, iNode) );
        vClass = Vec_WecEntry( p->vNpnConfigs, Abc_Lit2Var(pCutBest->iFunc) );
        Config = Vec_IntEntry( vClass, 0 );
        pObj = Abc_NtkCreateNode( pNtk );
        pObj->pData = Vec_PtrEntry( vNpnGatesMio, Abc_Lit2Var(pCutBest->iFunc) );
        assert( pObj->pData != NULL );
        fCompl = pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) ^ ((Config >> 16) & 1);
        Config &= 0xFFFF;
        for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
        {
            assert( (Config >> 6) < 720 );
            iMigLit = pCutBest->pLeaves[ (int)(p->Perm6[Config >> 6][k]) ];
            pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Abc_LitNotCond(iMigLit, (Config >> k) & 1) );
            Abc_ObjAddFanin( pObj, pFanin );
        }
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit(iNode, fCompl), Abc_ObjId(pObj) );
    }

    // create primary outputs
    Mig_ManForEachCo( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePo(pNtk);
        pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Mig_ObjFaninLit(pNode, 0) );
        Abc_ObjAddFanin( pObj, pFanin );
    }
    Abc_NtkAddDummyPoNames( pNtk );

    // clean up
    Vec_PtrFree( vNpnGatesMio );
    Vec_IntFree( vNodes );
    Vec_IntFree( vCopy );
    return pNtk;
}